

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

uint __thiscall OpenMesh::PolyConnectivity::valence(PolyConnectivity *this,VertexHandle _vh)

{
  Vertex *pVVar1;
  uint uVar2;
  undefined1 local_30 [8];
  ConstVertexVertexIter vv_it;
  
  pVVar1 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pVVar1->halfedge_handle_).super_BaseHandle.idx_;
  vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  uVar2 = 0;
  if ((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ != -1) {
    local_30 = (undefined1  [8])this;
    vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
         (int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
    do {
      if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return uVar2;
      }
      uVar2 = uVar2 + 1;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)local_30);
    } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  return uVar2;
}

Assistant:

uint PolyConnectivity::valence(VertexHandle _vh) const
{
  uint count(0);
  for (ConstVertexVertexIter vv_it=cvv_iter(_vh); vv_it.is_valid(); ++vv_it)
    ++count;
  return count;
}